

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QDockAreaLayout::indexOfPlaceHolder
          (QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QString *objectName)

{
  Data *pDVar1;
  ulong uVar2;
  ulong uVar3;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutInfo::indexOfPlaceHolder(__return_storage_ptr__,this->docks,objectName);
  if ((__return_storage_ptr__->d).size == 0) {
    this_00 = this->docks;
    uVar2 = 0xffffffffffffffff;
    do {
      uVar3 = uVar2;
      this_00 = this_00 + 1;
      pDVar1 = (__return_storage_ptr__->d).d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
        }
      }
      if (uVar3 == 2) goto LAB_003fcce8;
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      QDockAreaLayoutInfo::indexOfPlaceHolder(__return_storage_ptr__,this_00,objectName);
      uVar2 = uVar3 + 1;
    } while ((__return_storage_ptr__->d).size == 0);
    local_34 = (int)uVar3 + 2;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_34);
    if (2 < uVar3 + 1) {
LAB_003fcce8:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
  }
  else {
    local_34 = 0;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_34);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayout::indexOfPlaceHolder(const QString &objectName) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QList<int> result = docks[i].indexOfPlaceHolder(objectName);
        if (!result.isEmpty()) {
            result.prepend(i);
            return result;
        }
    }
    return QList<int>();
}